

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

void test_all<signed_char,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<signed_char,std::allocator<signed_char>>(std::vector<signed_char,std::allocator<signed_char>>)>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *to_bench,size_t attempts,
               function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
               *statistic,
               function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
               *prepare)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  iterator iVar3;
  logic_error *this;
  long lVar4;
  pointer __k;
  _Manager_type *pp_Var5;
  vector<signed_char,_std::allocator<signed_char>_> numbers;
  vector<signed_char,_std::allocator<signed_char>_> buffer;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>_>
  sort_calls;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  undefined1 local_6bb;
  undefined1 local_6ba;
  undefined1 local_6b9;
  vector<signed_char,_std::allocator<signed_char>_> local_6b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_698;
  size_t local_658;
  function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
  *local_650;
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  *local_648;
  vector<signed_char,_std::allocator<signed_char>_> local_640;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_628;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_5e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_5a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_568;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_528;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_4e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_4a8;
  _Any_data local_468;
  code *local_458;
  _Any_data local_448;
  code *local_438;
  _Any_data local_428;
  code *local_418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>
  local_408;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  local_90;
  
  local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_658 = attempts;
  local_650 = prepare;
  local_648 = statistic;
  utility::read<std::vector<signed_char,std::allocator<signed_char>>>
            ((istream *)&std::cin,&local_6b8);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&local_640,
             (long)local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator_type *)&local_390);
  local_698.first._M_dataplus._M_p = (pointer)&local_698.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_698,burst_radix_sort_call_name_abi_cxx11_._M_dataplus._M_p,
             burst_radix_sort_call_name_abi_cxx11_._M_dataplus._M_p +
             burst_radix_sort_call_name_abi_cxx11_._M_string_length);
  local_698.second.super__Function_base._M_functor._8_8_ = 0;
  local_698.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:99:9)>
       ::_M_invoke;
  local_698.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:99:9)>
       ::_M_manager;
  local_698.second.super__Function_base._M_functor._M_unused._M_object = &local_640;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_390,&burst_radix_sort_title_abi_cxx11_,&local_698);
  local_4a8.first._M_dataplus._M_p = (pointer)&local_4a8.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,burst_radix_sort_par_max_call_name_abi_cxx11_._M_dataplus._M_p,
             burst_radix_sort_par_max_call_name_abi_cxx11_._M_dataplus._M_p +
             burst_radix_sort_par_max_call_name_abi_cxx11_._M_string_length);
  local_4a8.second.super__Function_base._M_functor._8_8_ = 0;
  local_4a8.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:104:9)>
       ::_M_invoke;
  local_4a8.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:104:9)>
       ::_M_manager;
  local_4a8.second.super__Function_base._M_functor._M_unused._M_object = &local_640;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_330,&burst_radix_sort_par_max_title_abi_cxx11_,&local_4a8);
  local_4e8.first._M_dataplus._M_p = (pointer)&local_4e8.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,burst_radix_sort_par_2_call_name_abi_cxx11_._M_dataplus._M_p,
             burst_radix_sort_par_2_call_name_abi_cxx11_._M_dataplus._M_p +
             burst_radix_sort_par_2_call_name_abi_cxx11_._M_string_length);
  local_4e8.second.super__Function_base._M_functor._8_8_ = 0;
  local_4e8.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:110:9)>
       ::_M_invoke;
  local_4e8.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:110:9)>
       ::_M_manager;
  local_4e8.second.super__Function_base._M_functor._M_unused._M_object = &local_640;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_2d0,&burst_radix_sort_par_2_title_abi_cxx11_,&local_4e8);
  local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,burst_radix_sort_par_4_call_name_abi_cxx11_._M_dataplus._M_p,
             burst_radix_sort_par_4_call_name_abi_cxx11_._M_dataplus._M_p +
             burst_radix_sort_par_4_call_name_abi_cxx11_._M_string_length);
  local_528.second.super__Function_base._M_functor._8_8_ = 0;
  local_528.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:115:9)>
       ::_M_invoke;
  local_528.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:115:9)>
       ::_M_manager;
  local_528.second.super__Function_base._M_functor._M_unused._M_object = &local_640;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_270,&burst_radix_sort_par_4_title_abi_cxx11_,&local_528);
  local_568.first._M_dataplus._M_p = (pointer)&local_568.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_568,burst_radix_sort_par_8_call_name_abi_cxx11_._M_dataplus._M_p,
             burst_radix_sort_par_8_call_name_abi_cxx11_._M_dataplus._M_p +
             burst_radix_sort_par_8_call_name_abi_cxx11_._M_string_length);
  local_568.second.super__Function_base._M_functor._8_8_ = 0;
  local_568.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:120:9)>
       ::_M_invoke;
  local_568.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:120:9)>
       ::_M_manager;
  local_568.second.super__Function_base._M_functor._M_unused._M_object = &local_640;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_210,&burst_radix_sort_par_8_title_abi_cxx11_,&local_568);
  local_5a8.first._M_dataplus._M_p = (pointer)&local_5a8.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a8,burst_radix_sort_par_16_call_name_abi_cxx11_._M_dataplus._M_p,
             burst_radix_sort_par_16_call_name_abi_cxx11_._M_dataplus._M_p +
             burst_radix_sort_par_16_call_name_abi_cxx11_._M_string_length);
  local_5a8.second.super__Function_base._M_functor._8_8_ = 0;
  local_5a8.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:125:9)>
       ::_M_invoke;
  local_5a8.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:125:9)>
       ::_M_manager;
  local_5a8.second.super__Function_base._M_functor._M_unused._M_object = &local_640;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_1b0,&burst_radix_sort_par_16_title_abi_cxx11_,&local_5a8);
  local_5e8.first._M_dataplus._M_p = (pointer)&local_5e8.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e8,std_sort_call_name_abi_cxx11_._M_dataplus._M_p,
             std_sort_call_name_abi_cxx11_._M_dataplus._M_p +
             std_sort_call_name_abi_cxx11_._M_string_length);
  local_5e8.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_5e8.second.super__Function_base._M_functor._8_8_ = 0;
  local_5e8.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:130:9)>
       ::_M_invoke;
  local_5e8.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:130:9)>
       ::_M_manager;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_150,&std_sort_title_abi_cxx11_,&local_5e8);
  local_628.first._M_dataplus._M_p = (pointer)&local_628.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_628,std_stable_sort_call_name_abi_cxx11_._M_dataplus._M_p,
             std_stable_sort_call_name_abi_cxx11_._M_dataplus._M_p +
             std_stable_sort_call_name_abi_cxx11_._M_string_length);
  local_628.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_628.second.super__Function_base._M_functor._8_8_ = 0;
  local_628.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:135:9)>
       ::_M_invoke;
  local_628.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:135:9)>
       ::_M_manager;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_f0,&std_stable_sort_title_abi_cxx11_,&local_628);
  paVar1 = &local_408.first.field_2;
  local_408.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,boost_spreadsort_call_name_abi_cxx11_._M_dataplus._M_p,
             boost_spreadsort_call_name_abi_cxx11_._M_dataplus._M_p +
             boost_spreadsort_call_name_abi_cxx11_._M_string_length);
  local_408.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.second.super__Function_base._M_functor._8_8_ = 0;
  local_408.second._M_invoker =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:140:9)>
       ::_M_invoke;
  local_408.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/benchmark/burst/algorithm/radix_sort.cpp:140:9)>
       ::_M_manager;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>,_true>
            (&local_90,&boost_spreadsort_title_abi_cxx11_,&local_408);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_3c8,&local_390,&stack0xffffffffffffffd0,0,&local_6b9,&local_6ba,&local_6bb);
  lVar4 = -0x360;
  pp_Var5 = &local_90.second.second.super__Function_base._M_manager;
  do {
    if (*pp_Var5 != (_Manager_type)0x0) {
      (**pp_Var5)((_Any_data *)(pp_Var5 + -2),(_Any_data *)(pp_Var5 + -2),__destroy_functor);
    }
    if (pp_Var5 + -4 != (_Manager_type *)pp_Var5[-6]) {
      operator_delete(pp_Var5[-6],(long)pp_Var5[-4] + 1);
    }
    if (pp_Var5 + -8 != (_Manager_type *)pp_Var5[-10]) {
      operator_delete(pp_Var5[-10],(long)pp_Var5[-8] + 1);
    }
    pp_Var5 = pp_Var5 + -0xc;
    lVar4 = lVar4 + 0x60;
  } while (lVar4 != 0);
  if (local_408.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_408.second.super__Function_base._M_manager)
              ((_Any_data *)&local_408.second,(_Any_data *)&local_408.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_408.first._M_dataplus._M_p,
                    local_408.first.field_2._M_allocated_capacity + 1);
  }
  if (local_628.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_628.second.super__Function_base._M_manager)
              ((_Any_data *)&local_628.second,(_Any_data *)&local_628.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628.first._M_dataplus._M_p != &local_628.first.field_2) {
    operator_delete(local_628.first._M_dataplus._M_p,
                    local_628.first.field_2._M_allocated_capacity + 1);
  }
  if (local_5e8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5e8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_5e8.second,(_Any_data *)&local_5e8.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.first._M_dataplus._M_p != &local_5e8.first.field_2) {
    operator_delete(local_5e8.first._M_dataplus._M_p,
                    local_5e8.first.field_2._M_allocated_capacity + 1);
  }
  if (local_5a8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5a8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_5a8.second,(_Any_data *)&local_5a8.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.first._M_dataplus._M_p != &local_5a8.first.field_2) {
    operator_delete(local_5a8.first._M_dataplus._M_p,
                    local_5a8.first.field_2._M_allocated_capacity + 1);
  }
  if (local_568.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_568.second.super__Function_base._M_manager)
              ((_Any_data *)&local_568.second,(_Any_data *)&local_568.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568.first._M_dataplus._M_p != &local_568.first.field_2) {
    operator_delete(local_568.first._M_dataplus._M_p,
                    local_568.first.field_2._M_allocated_capacity + 1);
  }
  if (local_528.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_528.second.super__Function_base._M_manager)
              ((_Any_data *)&local_528.second,(_Any_data *)&local_528.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.first._M_dataplus._M_p != &local_528.first.field_2) {
    operator_delete(local_528.first._M_dataplus._M_p,
                    local_528.first.field_2._M_allocated_capacity + 1);
  }
  if (local_4e8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4e8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_4e8.second,(_Any_data *)&local_4e8.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.first._M_dataplus._M_p != &local_4e8.first.field_2) {
    operator_delete(local_4e8.first._M_dataplus._M_p,
                    local_4e8.first.field_2._M_allocated_capacity + 1);
  }
  if (local_4a8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4a8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_4a8.second,(_Any_data *)&local_4a8.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.first._M_dataplus._M_p != &local_4a8.first.field_2) {
    operator_delete(local_4a8.first._M_dataplus._M_p,
                    local_4a8.first.field_2._M_allocated_capacity + 1);
  }
  if (local_698.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_698.second.super__Function_base._M_manager)
              ((_Any_data *)&local_698.second,(_Any_data *)&local_698.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698.first._M_dataplus._M_p != &local_698.first.field_2) {
    operator_delete(local_698.first._M_dataplus._M_p,
                    local_698.first.field_2._M_allocated_capacity + 1);
  }
  __k = (to_bench->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (to_bench->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar2) {
    do {
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_3c8,__k);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_698.first._M_dataplus._M_p = (pointer)&local_698.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_698,anon_var_dwarf_fe758,anon_var_dwarf_fe758 + 0x45);
        std::operator+(&local_390.first,&local_698.first,__k);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698.first._M_dataplus._M_p != &local_698.first.field_2) {
          operator_delete(local_698.first._M_dataplus._M_p,
                          local_698.first.field_2._M_allocated_capacity + 1);
        }
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,(string *)&local_390);
        *(undefined ***)this = &PTR__logic_error_001a4588;
        __cxa_throw(this,&boost::program_options::error::typeinfo,std::logic_error::~logic_error);
      }
      std::
      function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
      ::function((function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
                  *)&local_428,
                 (function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
                  *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_true>
                           ._M_cur + 0x48));
      std::
      function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
      ::function((function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
                  *)&local_448,local_648);
      std::
      function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
      ::function((function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
                  *)&local_468,local_650);
      test_sort<std::function<void(__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>)>,std::vector<signed_char,std::allocator<signed_char>>,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<signed_char,std::allocator<signed_char>>(std::vector<signed_char,std::allocator<signed_char>>)>>
                ((string *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_true>
                        ._M_cur + 0x28),
                 (function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>
                  *)&local_428,&local_6b8,local_658,
                 (function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
                  *)&local_448,
                 (function<std::vector<signed_char,_std::allocator<signed_char>_>_(std::vector<signed_char,_std::allocator<signed_char>_>)>
                  *)&local_468);
      if (local_458 != (code *)0x0) {
        (*local_458)(&local_468,&local_468,__destroy_functor);
      }
      if (local_438 != (code *)0x0) {
        (*local_438)(&local_448,&local_448,__destroy_functor);
      }
      if (local_418 != (code *)0x0) {
        (*local_418)(&local_428,&local_428,__destroy_functor);
      }
      __k = __k + 1;
    } while (__k != pbVar2);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_3c8);
  if (local_640.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_640.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_640.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_640.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b8.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
    test_all
    (
        const std::vector<std::string> & to_bench,
        std::size_t attempts,
        UnaryFunction1 statistic,
        UnaryFunction2 prepare
    )
{
    std::vector<Value> numbers;
    utility::read(std::cin, numbers);

    std::vector<Value> buffer(numbers.size());

    auto radix_sort =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_max =
        [& buffer] (auto && ... args)
        {
            const auto par = burst::par(std::max(std::thread::hardware_concurrency(), 2u));
            return burst::radix_sort(par, std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_2 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(2), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_4 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(4), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_8 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(8), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_16 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(16), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto std_sort =
        [] (auto && ... args)
        {
            return std::sort(std::forward<decltype(args)>(args)...);
        };
    auto std_stable_sort =
        [] (auto && ... args)
        {
            return std::stable_sort(std::forward<decltype(args)>(args)...);
        };
    auto boost_spreadsort =
        [] (auto && ... args)
        {
            return boost::sort::spreadsort::spreadsort(std::forward<decltype(args)>(args)...);
        };

    using iterator_type = typename std::vector<Value>::iterator;
    using sort_call_type = std::function<void(iterator_type, iterator_type)>;
    auto sort_calls =
        std::unordered_map<std::string, std::pair<std::string, sort_call_type>>
        {
            {burst_radix_sort_title, {burst_radix_sort_call_name, radix_sort}},
            {burst_radix_sort_par_max_title, {burst_radix_sort_par_max_call_name, radix_sort_par_max}},
            {burst_radix_sort_par_2_title, {burst_radix_sort_par_2_call_name, radix_sort_par_2}},
            {burst_radix_sort_par_4_title, {burst_radix_sort_par_4_call_name, radix_sort_par_4}},
            {burst_radix_sort_par_8_title, {burst_radix_sort_par_8_call_name, radix_sort_par_8}},
            {burst_radix_sort_par_16_title, {burst_radix_sort_par_16_call_name, radix_sort_par_16}},
            {std_sort_title, {std_sort_call_name, std_sort}},
            {std_stable_sort_title, {std_stable_sort_call_name, std_stable_sort}},
            {boost_spreadsort_title, {boost_spreadsort_call_name, boost_spreadsort}}
        };

    for (const auto & sort_call_title: to_bench)
    {
        auto call_params = sort_calls.find(sort_call_title);
        if (call_params != sort_calls.end())
        {
            const auto & name = call_params->second.first;
            const auto & call = call_params->second.second;
            test_sort(name, call, numbers, attempts, statistic, prepare);
        }
        else
        {
            const auto error_message =
                u8"Неверный тип тестируемого алгоритма: "_u8s + sort_call_title;
            throw boost::program_options::error(error_message);
        }
    }
}